

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  xmlElementType xVar1;
  long lVar2;
  xmlEntityPtr pxVar3;
  FILE *pFVar4;
  xmlChar *pxVar5;
  undefined8 uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  _xmlAttr *attr;
  xmlNs *pxVar10;
  char local_13c8 [5000];
  undefined1 local_40;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar9 = "node is NULL\n";
    sVar8 = 0xd;
    goto LAB_00167225;
  }
  ctxt->node = node;
  switch(node->type) {
  case XML_ELEMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fwrite("ELEMENT ",8,1,(FILE *)ctxt->output);
      if ((node->ns != (xmlNs *)0x0) && (pxVar5 = node->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
        xmlCtxtDumpString(ctxt,pxVar5);
        fputc(0x3a,(FILE *)ctxt->output);
      }
      xmlCtxtDumpString(ctxt,node->name);
LAB_00167838:
      pFVar4 = (FILE *)ctxt->output;
LAB_00167840:
      fputc(10,pFVar4);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar4 = (FILE *)ctxt->output;
    pcVar9 = "Error, ATTRIBUTE found here\n";
    sVar8 = 0x1c;
    goto LAB_00167421;
  case XML_TEXT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      if (node->name == "textnoenc") {
        pcVar9 = "TEXT no enc";
        sVar8 = 0xb;
      }
      else {
        pcVar9 = "TEXT";
        sVar8 = 4;
      }
      fwrite(pcVar9,sVar8,1,(FILE *)ctxt->output);
      if ((ctxt->options & 1) == 0) goto LAB_00167838;
      if ((_xmlAttr **)node->content == &node->properties) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar9 = " compact\n";
        goto LAB_00167283;
      }
      iVar7 = xmlDictOwns(ctxt->dict,node->content);
      pFVar4 = (FILE *)ctxt->output;
      if (iVar7 == 1) {
        pcVar9 = " interned\n";
        sVar8 = 10;
        goto LAB_00167496;
      }
      goto LAB_00167840;
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "CDATA_SECTION\n";
LAB_0016744f:
      sVar8 = 0xe;
LAB_00167496:
      fwrite(pcVar9,sVar8,1,pFVar4);
    }
    break;
  case XML_ENTITY_REF_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pxVar5 = node->name;
      pcVar9 = "ENTITY_REF(%s)\n";
LAB_001674c8:
      fprintf(pFVar4,pcVar9,pxVar5);
    }
    break;
  case XML_ENTITY_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "ENTITY\n";
      sVar8 = 7;
      goto LAB_00167496;
    }
    break;
  case XML_PI_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pxVar5 = node->name;
      pcVar9 = "PI %s\n";
      goto LAB_001674c8;
    }
    break;
  case XML_COMMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "COMMENT\n";
      sVar8 = 8;
      goto LAB_00167496;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    pFVar4 = (FILE *)ctxt->output;
    pcVar9 = "Error, DOCUMENT found here\n";
    sVar8 = 0x1b;
LAB_00167421:
    fwrite(pcVar9,sVar8,1,pFVar4);
    goto LAB_00167aaa;
  case XML_DOCUMENT_TYPE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "DOCUMENT_TYPE\n";
      goto LAB_0016744f;
    }
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "DOCUMENT_FRAG\n";
      goto LAB_0016744f;
    }
    break;
  case XML_NOTATION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "NOTATION\n";
LAB_00167283:
      sVar8 = 9;
      goto LAB_00167496;
    }
    break;
  case XML_DTD_NODE:
    xmlCtxtDumpDtdNode(ctxt,(xmlDtdPtr)node);
    return;
  case XML_ELEMENT_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ELEMENT_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "Node is not an element declaration";
      uVar6 = 0x13a1;
LAB_00167697:
      fprintf(pFVar4,"ERROR %d: %s",uVar6,pcVar9);
      return;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Element declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ELEMDECL(",9,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_00167b7c;
    switch(*(undefined4 *)&node->ns) {
    case 0:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", UNDEFINED";
      sVar8 = 0xb;
      break;
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", EMPTY";
      sVar8 = 7;
      break;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", ANY";
      sVar8 = 5;
      break;
    case 3:
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", MIXED ";
      sVar8 = 8;
      break;
    default:
      goto switchD_001677a1_default;
    }
    fwrite(pcVar9,sVar8,1,pFVar4);
switchD_001677a1_default:
    if ((node->type != XML_ELEMENT_NODE) &&
       ((xmlElementContentPtr)node->content != (xmlElementContentPtr)0x0)) {
      local_13c8[0] = '\0';
      xmlSnprintfElementContent(local_13c8,5000,(xmlElementContentPtr)node->content,1);
      local_40 = 0;
      fputs(local_13c8,(FILE *)ctxt->output);
    }
    fputc(10,(FILE *)ctxt->output);
LAB_00167b7c:
    xmlCtxtGenericNodeCheck(ctxt,node);
    return;
  case XML_ATTRIBUTE_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ATTRIBUTE_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "Node is not an attribute declaration";
      uVar6 = 0x13a0;
      goto LAB_00167697;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Node attribute declaration has no name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"ATTRDECL(%s)");
    }
    lVar2._0_2_ = node->line;
    lVar2._2_2_ = node->extra;
    lVar2._4_4_ = *(undefined4 *)&node->field_0x74;
    if (lVar2 == 0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1398,
              "Node attribute declaration has no element name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output," for %s");
    }
    if (ctxt->check != 0) goto LAB_00167aaa;
    switch(*(undefined4 *)&node->content) {
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " CDATA";
      goto LAB_00167cb9;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " ID";
      sVar8 = 3;
      break;
    case 3:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " IDREF";
LAB_00167cb9:
      sVar8 = 6;
      break;
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " IDREFS";
      goto LAB_00167cca;
    case 5:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " ENTITY";
LAB_00167cca:
      sVar8 = 7;
      break;
    case 6:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " ENTITIES";
      goto LAB_00167cf8;
    case 7:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " NMTOKEN";
      sVar8 = 8;
      break;
    case 8:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " NMTOKENS";
LAB_00167cf8:
      sVar8 = 9;
      break;
    case 9:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " ENUMERATION";
      sVar8 = 0xc;
      break;
    case 10:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " NOTATION ";
      sVar8 = 10;
      break;
    default:
      goto switchD_00167744_default;
    }
    fwrite(pcVar9,sVar8,1,pFVar4);
switchD_00167744_default:
    pxVar10 = node->nsDef;
    if (pxVar10 != (xmlNs *)0x0) {
      iVar7 = 5;
      do {
        pcVar9 = "|%s";
        if (iVar7 == 5) {
          pcVar9 = " (%s";
        }
        fprintf((FILE *)ctxt->output,pcVar9,*(undefined8 *)&pxVar10->type);
        pxVar10 = pxVar10->next;
        if (pxVar10 == (_xmlNs *)0x0) {
          fputc(0x29,(FILE *)ctxt->output);
          goto LAB_00167d91;
        }
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      fwrite("...)",4,1,(FILE *)ctxt->output);
    }
LAB_00167d91:
    iVar7 = *(int *)((long)&node->content + 4);
    if (iVar7 == 4) {
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = " FIXED";
      sVar8 = 6;
LAB_00167dd5:
      fwrite(pcVar9,sVar8,1,pFVar4);
    }
    else {
      if (iVar7 == 3) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar9 = " IMPLIED";
        sVar8 = 8;
        goto LAB_00167dd5;
      }
      if (iVar7 == 2) {
        pFVar4 = (FILE *)ctxt->output;
        pcVar9 = " REQUIRED";
        sVar8 = 9;
        goto LAB_00167dd5;
      }
    }
    if (node->properties != (_xmlAttr *)0x0) {
      fputc(0x22,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,(xmlChar *)node->properties);
      fputc(0x22,(FILE *)ctxt->output);
    }
LAB_00167e0c:
    fputc(10,(FILE *)ctxt->output);
    goto LAB_00167aaa;
  case XML_ENTITY_DECL:
    xmlCtxtDumpSpaces(ctxt);
    if (node->type != XML_ENTITY_DECL) {
      ctxt->errors = ctxt->errors + 1;
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = "Node is not an entity declaration";
      uVar6 = 0x13a2;
      goto LAB_00167697;
    }
    if (node->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Entity declaration has no name");
    }
    else if (ctxt->check == 0) {
      fwrite("ENTITYDECL(",0xb,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,node->name);
      fputc(0x29,(FILE *)ctxt->output);
    }
    if (ctxt->check != 0) goto LAB_00167aaa;
    switch(*(undefined4 *)((long)&node->properties + 4)) {
    case 1:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", internal\n";
      goto LAB_00167ba7;
    case 2:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", external parsed\n";
      sVar8 = 0x12;
      break;
    case 3:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", unparsed\n";
LAB_00167ba7:
      sVar8 = 0xb;
      break;
    case 4:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", parameter\n";
      sVar8 = 0xc;
      break;
    case 5:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", external parameter\n";
      sVar8 = 0x15;
      break;
    case 6:
      pFVar4 = (FILE *)ctxt->output;
      pcVar9 = ", predefined\n";
      sVar8 = 0xd;
      break;
    default:
      goto switchD_00167804_default;
    }
    fwrite(pcVar9,sVar8,1,pFVar4);
switchD_00167804_default:
    if (node->nsDef != (xmlNs *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," ExternalID=%s\n",node->nsDef);
    }
    if (node->psvi != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," SystemID=%s\n",node->psvi);
    }
    if (node[1]._private != (void *)0x0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output," URI=%s\n",node[1]._private);
    }
    if (node->content == (xmlChar *)0x0) goto LAB_00167aaa;
    xmlCtxtDumpSpaces(ctxt);
    fwrite(" content=",9,1,(FILE *)ctxt->output);
    xmlCtxtDumpString(ctxt,node->content);
    goto LAB_00167e0c;
  case XML_NAMESPACE_DECL:
    xmlCtxtDumpNamespace(ctxt,(xmlNsPtr)node);
    return;
  case XML_XINCLUDE_START:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar9 = "INCLUDE START\n";
    sVar8 = 0xe;
    goto LAB_00167225;
  case XML_XINCLUDE_END:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    pFVar4 = (FILE *)ctxt->output;
    pcVar9 = "INCLUDE END\n";
    sVar8 = 0xc;
LAB_00167225:
    fwrite(pcVar9,sVar8,1,pFVar4);
    return;
  default:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    xVar1 = node->type;
    ctxt->errors = ctxt->errors + 1;
    fprintf((FILE *)ctxt->output,"ERROR %d: ",0x1393);
    fprintf((FILE *)ctxt->output,"Unknown node type %d\n",(ulong)xVar1);
    return;
  }
  if (node->doc == (_xmlDoc *)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fwrite("PBM: doc == NULL !!!\n",0x15,1,(FILE *)ctxt->output);
  }
  ctxt->depth = ctxt->depth + 1;
  if (node->type == XML_ELEMENT_NODE) {
    for (pxVar10 = node->nsDef; pxVar10 != (xmlNsPtr)0x0; pxVar10 = pxVar10->next) {
      xmlCtxtDumpNamespace(ctxt,pxVar10);
    }
  }
  if (node->type == XML_ELEMENT_NODE) {
    for (attr = node->properties; attr != (xmlAttrPtr)0x0; attr = attr->next) {
      xmlCtxtDumpAttr(ctxt,attr);
    }
  }
  if (node->type == XML_ELEMENT_NODE) goto LAB_00167aa7;
  if (node->type != XML_ENTITY_REF_NODE) {
    if ((node->content == (xmlChar *)0x0) || (ctxt->check != 0)) goto LAB_00167aa7;
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar5 = node->content;
    goto LAB_00167a92;
  }
  pxVar3 = xmlGetDocEntity(node->doc,node->name);
  if ((pxVar3 == (xmlEntityPtr)0x0) || (xmlCtxtDumpSpaces(ctxt), ctxt->check != 0))
  goto LAB_00167aa7;
  switch(pxVar3->etype) {
  case XML_INTERNAL_GENERAL_ENTITY:
    pcVar9 = "INTERNAL_GENERAL_ENTITY ";
    sVar8 = 0x18;
    break;
  case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
    pcVar9 = "EXTERNAL_GENERAL_PARSED_ENTITY ";
    sVar8 = 0x1f;
    break;
  case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
    pcVar9 = "EXTERNAL_GENERAL_UNPARSED_ENTITY ";
    sVar8 = 0x21;
    break;
  case XML_INTERNAL_PARAMETER_ENTITY:
    pcVar9 = "INTERNAL_PARAMETER_ENTITY ";
    goto LAB_001679c8;
  case XML_EXTERNAL_PARAMETER_ENTITY:
    pcVar9 = "EXTERNAL_PARAMETER_ENTITY ";
LAB_001679c8:
    sVar8 = 0x1a;
    break;
  default:
    fprintf((FILE *)ctxt->output,"ENTITY_%d ! ");
    goto LAB_001679e5;
  }
  fwrite(pcVar9,sVar8,1,(FILE *)ctxt->output);
LAB_001679e5:
  fprintf((FILE *)ctxt->output,"%s\n",pxVar3->name);
  if (pxVar3->ExternalID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"ExternalID=%s\n",pxVar3->ExternalID);
  }
  if (pxVar3->SystemID != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"SystemID=%s\n",pxVar3->SystemID);
  }
  if (pxVar3->URI != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"URI=%s\n",pxVar3->URI);
  }
  if (pxVar3->content != (xmlChar *)0x0) {
    xmlCtxtDumpSpaces(ctxt);
    fwrite("content=",8,1,(FILE *)ctxt->output);
    pxVar5 = pxVar3->content;
LAB_00167a92:
    xmlCtxtDumpString(ctxt,pxVar5);
    fputc(10,(FILE *)ctxt->output);
  }
LAB_00167aa7:
  ctxt->depth = ctxt->depth + -1;
LAB_00167aaa:
  xmlCtxtGenericNodeCheck(ctxt,node);
  return;
}

Assistant:

static void
xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    ctxt->node = node;

    switch (node->type) {
        case XML_ELEMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ELEMENT ");
                if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
                    xmlCtxtDumpString(ctxt, node->ns->prefix);
                    fprintf(ctxt->output, ":");
                }
                xmlCtxtDumpString(ctxt, node->name);
                fprintf(ctxt->output, "\n");
            }
            break;
        case XML_ATTRIBUTE_NODE:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "Error, ATTRIBUTE found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_TEXT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                if (node->name == (const xmlChar *) xmlStringTextNoenc)
                    fprintf(ctxt->output, "TEXT no enc");
                else
                    fprintf(ctxt->output, "TEXT");
		if (ctxt->options & DUMP_TEXT_TYPE) {
		    if (node->content == (xmlChar *) &(node->properties))
			fprintf(ctxt->output, " compact\n");
		    else if (xmlDictOwns(ctxt->dict, node->content) == 1)
			fprintf(ctxt->output, " interned\n");
		    else
			fprintf(ctxt->output, "\n");
		} else
		    fprintf(ctxt->output, "\n");
            }
            break;
        case XML_CDATA_SECTION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "CDATA_SECTION\n");
            }
            break;
        case XML_ENTITY_REF_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY_REF(%s)\n",
                        (char *) node->name);
            }
            break;
        case XML_ENTITY_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY\n");
            }
            break;
        case XML_PI_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "PI %s\n", (char *) node->name);
            }
            break;
        case XML_COMMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "COMMENT\n");
            }
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
            }
            fprintf(ctxt->output, "Error, DOCUMENT found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_DOCUMENT_TYPE_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_TYPE\n");
            }
            break;
        case XML_DOCUMENT_FRAG_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_FRAG\n");
            }
            break;
        case XML_NOTATION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "NOTATION\n");
            }
            break;
        case XML_DTD_NODE:
            xmlCtxtDumpDtdNode(ctxt, (xmlDtdPtr) node);
            return;
        case XML_ELEMENT_DECL:
            xmlCtxtDumpElemDecl(ctxt, (xmlElementPtr) node);
            return;
        case XML_ATTRIBUTE_DECL:
            xmlCtxtDumpAttrDecl(ctxt, (xmlAttributePtr) node);
            return;
        case XML_ENTITY_DECL:
            xmlCtxtDumpEntityDecl(ctxt, (xmlEntityPtr) node);
            return;
        case XML_NAMESPACE_DECL:
            xmlCtxtDumpNamespace(ctxt, (xmlNsPtr) node);
            return;
        case XML_XINCLUDE_START:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE START\n");
            }
            return;
        case XML_XINCLUDE_END:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE END\n");
            }
            return;
        default:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", node->type);
            return;
    }
    if (node->doc == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
        }
        fprintf(ctxt->output, "PBM: doc == NULL !!!\n");
    }
    ctxt->depth++;
    if ((node->type == XML_ELEMENT_NODE) && (node->nsDef != NULL))
        xmlCtxtDumpNamespaceList(ctxt, node->nsDef);
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL))
        xmlCtxtDumpAttrList(ctxt, node->properties);
    if (node->type != XML_ENTITY_REF_NODE) {
        if ((node->type != XML_ELEMENT_NODE) && (node->content != NULL)) {
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "content=");
                xmlCtxtDumpString(ctxt, node->content);
                fprintf(ctxt->output, "\n");
            }
        }
    } else {
        xmlEntityPtr ent;

        ent = xmlGetDocEntity(node->doc, node->name);
        if (ent != NULL)
            xmlCtxtDumpEntity(ctxt, ent);
    }
    ctxt->depth--;

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, node);
}